

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_parser.cpp
# Opt level: O3

void __thiscall
Parser_parseModelWithImportedEquivVariables_Test::~Parser_parseModelWithImportedEquivVariables_Test
          (Parser_parseModelWithImportedEquivVariables_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, parseModelWithImportedEquivVariables)
{
    auto parser = libcellml::Parser::create();
    auto modelContents = fileContents("importingModel.cellml");
    auto model = parser->parseModel(modelContents);

    auto printer = libcellml::Printer::create();
    auto serialisedModel = printer->printModel(model);

    EXPECT_EQ(modelContents, serialisedModel);
}